

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::Deallocate<1ul,std::allocator<char>>(allocator<char> *alloc,void *p,size_t n)

{
  if (n != 0) {
    operator_delete(p,n);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                ,0x1222,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 1UL, Alloc = std::allocator<char>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n)
		{
			static_assert(Alignment > 0, "");
			assert(n && "n must be positive");
			struct alignas(Alignment) M {};
			using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
			using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
			A mem_alloc(*alloc);
			AT::deallocate(mem_alloc, static_cast<M*>(p),
			               (n + sizeof(M) - 1) / sizeof(M));
		}